

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffseek(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  FILE *__stream;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,(int *)0x0);
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp == '\x01') {
    fseek(__stream,(ctx->bifcxrun->runcxsp->runsv).runsvnum,0);
    return;
  }
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void biffseek(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    long      pos;

    /* get the file pointer */
    bifcntargs(ctx, 2, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* get the seek position, and seek there */
    pos = runpopnum(ctx->bifcxrun);
    osfseek(fp, pos, OSFSK_SET);
}